

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendmsg2.c
# Opt level: O0

objc_slot2 * objc_slot_lookup_super2(objc_super *super,SEL selector)

{
  id obj;
  BOOL BVar1;
  dtable_t pSVar2;
  IMP p_Var3;
  undefined8 *puVar4;
  Class class_1;
  objc_slot2 *result;
  Class class;
  id receiver;
  SEL selector_local;
  objc_super *super_local;
  uintptr_t addr;
  Class local_10;
  
  obj = super->receiver;
  if (obj == (id)0x0) {
    super_local = (objc_super *)&nil_slot;
  }
  else {
    pSVar2 = dtable_for_class(super->class);
    super_local = (objc_super *)SparseArrayLookup(pSVar2,(uint32_t)(selector->field_0).index);
    if (super_local == (objc_super *)0x0) {
      BVar1 = isSmallObject(obj);
      if (BVar1 == '\0') {
        local_10 = obj->isa;
      }
      else {
        local_10 = SmallObjectClasses[(ulong)obj & 7];
      }
      pSVar2 = dtable_for_class(local_10);
      if (pSVar2 == uninstalled_dtable) {
        BVar1 = class_isMetaClass(local_10);
        if (BVar1 == '\0') {
          objc_send_initialize((id)local_10);
        }
        else {
          objc_send_initialize(obj);
        }
        objc_send_initialize((id)local_10);
        super_local = (objc_super *)objc_slot_lookup_super2(super,selector);
      }
      else {
        p_Var3 = (*__objc_msg_forward2)(obj,selector);
        puVar4 = (undefined8 *)__tls_get_addr(&PTR_0014af58);
        *puVar4 = p_Var3;
        super_local = (objc_super *)__tls_get_addr(&PTR_0014af58);
      }
    }
  }
  return (objc_slot2 *)super_local;
}

Assistant:

struct objc_slot2 *objc_slot_lookup_super2(struct objc_super *super, SEL selector)
{
	id receiver = super->receiver;
	if (receiver)
	{
		Class class = super->class;
		struct objc_slot2 * result = objc_dtable_lookup(dtable_for_class(class),
				selector->index);
		if (0 == result)
		{
			Class class = classForObject(receiver);
			// Dtable should always be installed in the superclass in
			// Objective-C, but may not be for other languages (Python).
			if (dtable_for_class(class) == uninstalled_dtable)
			{
				if (class_isMetaClass(class))
				{
					objc_send_initialize(receiver);
				}
				else
				{
					objc_send_initialize((id)class);
				}
				objc_send_initialize((id)class);
				return objc_slot_lookup_super2(super, selector);
			}
			uncacheable_slot.imp = __objc_msg_forward2(receiver, selector);
			return (struct objc_slot2*)&uncacheable_slot;
		}
		return result;
	}
	return (struct objc_slot2*)&nil_slot;
}